

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface_p.h
# Opt level: O0

void __thiscall
QFutureCallOutEvent::QFutureCallOutEvent
          (QFutureCallOutEvent *this,CallOutType callOutType,int index1,QString *text)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  QEvent *in_RDI;
  QString *in_stack_ffffffffffffffd8;
  
  QEvent::QEvent(in_RDI,FutureCallOut);
  in_RDI->_vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_00bea750;
  *(undefined4 *)&in_RDI[1]._vptr_QEvent = in_ESI;
  *(undefined4 *)((long)&in_RDI[1]._vptr_QEvent + 4) = in_EDX;
  in_RDI[1].t = 0xffff;
  in_RDI[1].m_posted = true;
  in_RDI[1].m_spont = true;
  QString::QString((QString *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

QFutureCallOutEvent(CallOutType callOutType, int index1, const QString &text)
        : QEvent(QEvent::FutureCallOut),
          callOutType(callOutType),
          index1(index1),
          index2(-1),
          text(text)
    { }